

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_xmlRegisterErrorHandler(PyObject *self,PyObject *args)

{
  PyObject *pPVar1;
  int iVar2;
  PyObject *pPVar3;
  PyObject *pyobj_ctx;
  PyObject *pyobj_f;
  PyObject *local_18;
  PyObject *local_10;
  
  pPVar3 = (PyObject *)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"OO:xmlRegisterErrorHandler",&local_10,&local_18);
  pPVar1 = libxml_xmlPythonErrorFuncHandler;
  if (iVar2 != 0) {
    if ((libxml_xmlPythonErrorFuncHandler != (PyObject *)0x0) &&
       (libxml_xmlPythonErrorFuncHandler->ob_refcnt =
             libxml_xmlPythonErrorFuncHandler->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    pPVar1 = libxml_xmlPythonErrorFuncCtxt;
    if ((libxml_xmlPythonErrorFuncCtxt != (PyObject *)0x0) &&
       (libxml_xmlPythonErrorFuncCtxt->ob_refcnt = libxml_xmlPythonErrorFuncCtxt->ob_refcnt + -1,
       pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    if (local_18 != (PyObject *)0x0) {
      local_18->ob_refcnt = local_18->ob_refcnt + 1;
    }
    if (local_10 != (PyObject *)0x0) {
      local_10->ob_refcnt = local_10->ob_refcnt + 1;
    }
    libxml_xmlPythonErrorFuncHandler = local_10;
    libxml_xmlPythonErrorFuncCtxt = local_18;
    pPVar3 = libxml_intWrap(1);
  }
  return pPVar3;
}

Assistant:

static PyObject *
libxml_xmlRegisterErrorHandler(ATTRIBUTE_UNUSED PyObject * self,
                               PyObject * args)
{
    PyObject *py_retval;
    PyObject *pyobj_f;
    PyObject *pyobj_ctx;

    if (!PyArg_ParseTuple
        (args, (char *) "OO:xmlRegisterErrorHandler", &pyobj_f,
         &pyobj_ctx))
        return (NULL);

#ifdef DEBUG_ERROR
    printf("libxml_xmlRegisterErrorHandler(%p, %p) called\n", pyobj_ctx,
           pyobj_f);
#endif

    if (libxml_xmlPythonErrorFuncHandler != NULL) {
        Py_XDECREF(libxml_xmlPythonErrorFuncHandler);
    }
    if (libxml_xmlPythonErrorFuncCtxt != NULL) {
        Py_XDECREF(libxml_xmlPythonErrorFuncCtxt);
    }

    Py_XINCREF(pyobj_ctx);
    Py_XINCREF(pyobj_f);

    /* TODO: check f is a function ! */
    libxml_xmlPythonErrorFuncHandler = pyobj_f;
    libxml_xmlPythonErrorFuncCtxt = pyobj_ctx;

    py_retval = libxml_intWrap(1);
    return (py_retval);
}